

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

void __thiscall
Hospital::Update_Bill_File
          (Hospital *this,vector<Patient,_std::allocator<Patient>_> *All_Of_Patients,
          ofstream *inFile)

{
  size_type sVar1;
  reference pvVar2;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pvVar3;
  reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  int local_238;
  int local_234;
  int k;
  int j;
  int i;
  ostream local_220 [8];
  ofstream abus;
  ofstream *inFile_local;
  vector<Patient,_std::allocator<Patient>_> *All_Of_Patients_local;
  Hospital *this_local;
  
  system("pause");
  std::ofstream::ofstream(local_220);
  std::ofstream::open((char *)local_220,0x1312b8);
  k = 0;
  while( true ) {
    sVar1 = std::vector<Patient,_std::allocator<Patient>_>::size(All_Of_Patients);
    if (sVar1 <= (ulong)(long)k) break;
    local_234 = 0;
    while( true ) {
      pvVar2 = std::vector<Patient,_std::allocator<Patient>_>::operator[](All_Of_Patients,(long)k);
      pvVar3 = Patient::Bill_Info_getter_abi_cxx11_(pvVar2);
      sVar1 = std::
              vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::size(pvVar3);
      if (sVar1 <= (ulong)(long)local_234) break;
      local_238 = 0;
      while( true ) {
        pvVar2 = std::vector<Patient,_std::allocator<Patient>_>::operator[](All_Of_Patients,(long)k)
        ;
        pvVar3 = Patient::Bill_Info_getter_abi_cxx11_(pvVar2);
        pvVar4 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](pvVar3,0);
        sVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(pvVar4);
        if (sVar1 <= (ulong)(long)local_238) break;
        pvVar2 = std::vector<Patient,_std::allocator<Patient>_>::operator[](All_Of_Patients,(long)k)
        ;
        pvVar3 = Patient::Bill_Info_getter_abi_cxx11_(pvVar2);
        pvVar4 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](pvVar3,(long)local_234);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvVar4,(long)local_238);
        poVar6 = std::operator<<(local_220,(string *)pvVar5);
        std::operator<<(poVar6," ");
        local_238 = local_238 + 1;
      }
      local_234 = local_234 + 1;
    }
    std::operator<<(local_220,"\n");
    k = k + 1;
  }
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void Hospital:: Update_Bill_File (vector<Patient>&All_Of_Patients , ofstream& inFile) {
    system("pause");
    //  cout << "hiiiii";
    ofstream abus;
    abus.open("Bill.txt");
    //abus <<"Asghar";

    for (int i = 0; i < All_Of_Patients.size(); i++) {
        for (int j = 0; j < All_Of_Patients[i].Bill_Info_getter().size(); ++j) {
            for (int k = 0; k <All_Of_Patients[i].Bill_Info_getter()[0].size() ; ++k) {
                abus << All_Of_Patients[i].Bill_Info_getter()[j][k] << " ";
            }
//            abus <<"Asghar";
        }
        abus << "\n";
    }
    //inFile.close();

}